

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O0

void __thiscall random_tests::stdrandom_test::test_method(stdrandom_test *this)

{
  initializer_list<int> __l;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  bool bVar1;
  undefined1 uVar2;
  FastRandomContext *__g;
  lazy_ostream *plVar3;
  long in_FS_OFFSET;
  int x;
  int i;
  int j;
  vector<int,_std::allocator<int>_> test;
  uniform_int_distribution<int> distribution;
  FastRandomContext ctx;
  FastRandomContext *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd08;
  const_string *in_stack_fffffffffffffd10;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  int iVar4;
  undefined4 in_stack_fffffffffffffd94;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd98;
  const_string local_258 [2];
  lazy_ostream local_238 [2];
  int local_1d0;
  undefined1 local_1c9 [25];
  const_string local_1b0 [2];
  assertion_result local_170 [2];
  const_string local_138 [2];
  lazy_ostream local_118 [2];
  assertion_result local_f8 [2];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (bool)in_stack_fffffffffffffce7);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_fffffffffffffcd8,0,0x93de2a);
  for (iVar4 = 0; iVar4 < 100; iVar4 = iVar4 + 1) {
    std::uniform_int_distribution<int>::operator()
              ((uniform_int_distribution<int> *)
               CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
               (FastRandomContext *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                 (pointer)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                 (unsigned_long)in_stack_fffffffffffffcd8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                 (size_t)in_stack_fffffffffffffd08._M_current,
                 (const_string *)in_stack_fffffffffffffd00._M_current);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                 (bool)in_stack_fffffffffffffce7);
      __g = (FastRandomContext *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                 (pointer)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                 (unsigned_long)in_stack_fffffffffffffcd8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                 (pointer)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                 (unsigned_long)in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffcd8 = (FastRandomContext *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_f8,local_118,local_138,0xc9,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffcd8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffcd8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                 (pointer)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                 (unsigned_long)in_stack_fffffffffffffcd8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                 (size_t)in_stack_fffffffffffffd08._M_current,
                 (const_string *)in_stack_fffffffffffffd00._M_current);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                 (bool)in_stack_fffffffffffffce7);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                 (pointer)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                 (unsigned_long)in_stack_fffffffffffffcd8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                 (pointer)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                 (unsigned_long)in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffcd8 = (FastRandomContext *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_170,(lazy_ostream *)&stack0xfffffffffffffe70,local_1b0,0xca,CHECK,CHECK_PRED)
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffcd8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffcd8);
      uVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)uVar2);
    local_a8 = 0x600000005;
    uStack_a0 = 0x800000007;
    local_b8 = 0x200000001;
    uStack_b0 = 0x400000003;
    local_98 = 0xa00000009;
    in_stack_fffffffffffffd18 = (vector<int,_std::allocator<int>_> *)local_1c9;
    std::allocator<int>::allocator((allocator<int> *)in_stack_fffffffffffffcd8);
    __l._M_array._7_1_ = uVar2;
    __l._M_array._0_7_ = in_stack_fffffffffffffd20;
    __l._M_len = (size_type)plVar3;
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffffd18,__l,(allocator_type *)in_stack_fffffffffffffd10);
    std::allocator<int>::~allocator((allocator<int> *)in_stack_fffffffffffffcd8);
    in_stack_fffffffffffffd10 = (const_string *)(local_1c9 + 1);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
    __last._M_current._4_4_ = in_stack_fffffffffffffd94;
    __last._M_current._0_4_ = iVar4;
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,FastRandomContext&>
              (in_stack_fffffffffffffd98,__last,__g);
    for (local_1d0 = 1; local_1d0 < 0xb; local_1d0 = local_1d0 + 1) {
      do {
        in_stack_fffffffffffffd08._M_current =
             boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                   (pointer)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                   (unsigned_long)in_stack_fffffffffffffcd8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (size_t)in_stack_fffffffffffffd08._M_current,
                   (const_string *)in_stack_fffffffffffffd00._M_current);
        std::vector<int,_std::allocator<int>_>::begin
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
        in_stack_fffffffffffffd00 =
             std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                       (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                        (int *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
        std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
        __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8)
                   ,(bool)in_stack_fffffffffffffce7);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                   (pointer)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                   (unsigned_long)in_stack_fffffffffffffcd8);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                   (basic_cstring<const_char> *)in_stack_fffffffffffffcd8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                   (pointer)CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),
                   (unsigned_long)in_stack_fffffffffffffcd8);
        in_stack_fffffffffffffcd8 = (FastRandomContext *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&stack0xfffffffffffffdf8,local_238,local_258,0xcf,CHECK,
                   CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffffcd8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffcd8);
        in_stack_fffffffffffffcef = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffffcef);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
  }
  FastRandomContext::~FastRandomContext(in_stack_fffffffffffffcd8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(stdrandom_test)
{
    FastRandomContext ctx;
    std::uniform_int_distribution<int> distribution(3, 9);
    for (int i = 0; i < 100; ++i) {
        int x = distribution(ctx);
        BOOST_CHECK(x >= 3);
        BOOST_CHECK(x <= 9);

        std::vector<int> test{1, 2, 3, 4, 5, 6, 7, 8, 9, 10};
        std::shuffle(test.begin(), test.end(), ctx);
        for (int j = 1; j <= 10; ++j) {
            BOOST_CHECK(std::find(test.begin(), test.end(), j) != test.end());
        }
    }
}